

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_detach_item_via_pointer_should_detach_items(void)

{
  long lVar1;
  cJSON *pcVar2;
  long in_FS_OFFSET;
  undefined1 local_158 [8];
  cJSON parent [1];
  cJSON list [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&parent[0].string,0,0x100);
  parent[0].string = (char *)&list[0].string;
  list[0].string = (char *)&list[1].string;
  list[1].string = (char *)&list[2].string;
  list[3].next = (cJSON *)&list[1].string;
  list[2].next = (cJSON *)&list[0].string;
  list[1].next = (cJSON *)&parent[0].string;
  list[0].next = (cJSON *)&list[2].string;
  parent[0].prev = (cJSON *)&parent[0].string;
  pcVar2 = cJSON_DetachItemViaPointer((cJSON *)local_158,(cJSON *)&list[0].string);
  if (pcVar2 != (cJSON *)&list[0].string) {
    UnityFail("Failed to detach in the middle.",0x107);
  }
  if ((list[1].next != (cJSON *)0x0) || (list[0].string != (char *)0x0)) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0x108);
  }
  if (((char **)parent[0].string != &list[1].string) || (list[2].next != (cJSON *)&parent[0].string)
     ) {
    UnityFail(" Expected TRUE Was FALSE",0x109);
  }
  pcVar2 = cJSON_DetachItemViaPointer((cJSON *)local_158,(cJSON *)&parent[0].string);
  if (pcVar2 != (cJSON *)&parent[0].string) {
    UnityFail("Failed to detach beginning.",0x10c);
  }
  if ((list[0].next != (cJSON *)0x0) || (parent[0].string != (char *)0x0)) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0x10d);
  }
  if ((list[2].next != (cJSON *)&list[2].string) || (parent[0].prev != (cJSON *)&list[1].string)) {
    UnityFail("Didn\'t set the new beginning.",0x10e);
  }
  pcVar2 = cJSON_DetachItemViaPointer((cJSON *)local_158,(cJSON *)&list[2].string);
  if (pcVar2 != (cJSON *)&list[2].string) {
    UnityFail("Failed to detach end.",0x111);
  }
  if ((list[3].next != (cJSON *)0x0) || (list[2].string != (char *)0x0)) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0x112);
  }
  if ((list[1].string != (char *)0x0) || (parent[0].prev != (cJSON *)&list[1].string)) {
    UnityFail("Didn\'t set the new end",0x113);
  }
  pcVar2 = cJSON_DetachItemViaPointer((cJSON *)local_158,(cJSON *)&list[1].string);
  if (pcVar2 != (cJSON *)&list[1].string) {
    UnityFail("Failed to detach single item.",0x116);
  }
  if ((list[2].next != (cJSON *)0x0) || (list[1].string != (char *)0x0)) {
    UnityFail("Didn\'t set pointers of detached item to NULL.",0x117);
  }
  if (parent[0].prev != (cJSON *)0x0) {
    UnityFail("Child of the parent wasn\'t set to NULL.",0x118);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_detach_item_via_pointer_should_detach_items(void)
{
    cJSON list[4];
    cJSON parent[1];

    memset(list, '\0', sizeof(list));

    /* link the list */
    list[0].next = &(list[1]);
    list[1].next = &(list[2]);
    list[2].next = &(list[3]);

    list[3].prev = &(list[2]);
    list[2].prev = &(list[1]);
    list[1].prev = &(list[0]);
    list[0].prev = &(list[3]);

    parent->child = &list[0];

    /* detach in the middle (list[1]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[1])) == &(list[1]), "Failed to detach in the middle.");
    TEST_ASSERT_TRUE_MESSAGE((list[1].prev == NULL) && (list[1].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE((list[0].next == &(list[2])) && (list[2].prev == &(list[0])));

    /* detach beginning (list[0]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[0])) == &(list[0]), "Failed to detach beginning.");
    TEST_ASSERT_TRUE_MESSAGE((list[0].prev == NULL) && (list[0].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].prev == &(list[3])) && (parent->child == &(list[2])), "Didn't set the new beginning.");

    /* detach end (list[3])*/
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[3])) == &(list[3]), "Failed to detach end.");
    TEST_ASSERT_TRUE_MESSAGE((list[3].prev == NULL) && (list[3].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].next == NULL) && (parent->child == &(list[2])), "Didn't set the new end");

    /* detach single item (list[2]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &list[2]) == &list[2], "Failed to detach single item.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].prev == NULL) && (list[2].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_NULL_MESSAGE(parent->child, "Child of the parent wasn't set to NULL.");
}